

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O0

int __thiscall
Storage::Tape::Oric::Parser::get_next_byte
          (Parser *this,shared_ptr<Storage::Tape::Tape> *tape,bool use_fast_encoding)

{
  int iVar1;
  SymbolType SVar2;
  uint uVar3;
  element_type *peVar4;
  DetectionMode DVar5;
  uint local_38;
  byte local_31;
  int local_24;
  SymbolType symbol;
  int bit_count;
  int result;
  bool use_fast_encoding_local;
  shared_ptr<Storage::Tape::Tape> *tape_local;
  Parser *this_local;
  
  DVar5 = SlowZero;
  if (use_fast_encoding) {
    DVar5 = FastZero;
  }
  this->detection_mode_ = DVar5;
  this->cycle_length_ = 0.0;
  symbol = One;
  local_24 = 0;
  while( true ) {
    local_31 = 0;
    if (local_24 < 0xb) {
      peVar4 = std::
               __shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)tape);
      iVar1 = (**peVar4->_vptr_Tape)();
      local_31 = (byte)iVar1 ^ 0xff;
    }
    if ((local_31 & 1) == 0) break;
    SVar2 = Parser<Storage::Tape::Oric::SymbolType>::get_next_symbol
                      ((Parser<Storage::Tape::Oric::SymbolType> *)this,tape);
    if ((local_24 != 0) || (SVar2 == Zero)) {
      this->detection_mode_ = (uint)!use_fast_encoding;
      symbol = (uint)(SVar2 == One) << ((byte)local_24 & 0x1f) | symbol;
      local_24 = local_24 + 1;
    }
  }
  peVar4 = std::__shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)tape);
  uVar3 = (**peVar4->_vptr_Tape)();
  if ((uVar3 & 1) == 0) {
    local_38 = (int)symbol >> 1 & 0xff;
  }
  else {
    local_38 = 0xffffffff;
  }
  return local_38;
}

Assistant:

int Parser::get_next_byte(const std::shared_ptr<Storage::Tape::Tape> &tape, bool use_fast_encoding) {
	detection_mode_ = use_fast_encoding ? FastZero : SlowZero;
	cycle_length_ = 0.0f;

	int result = 0;
	int bit_count = 0;
	while(bit_count < 11 && !tape->is_at_end()) {
		SymbolType symbol = get_next_symbol(tape);
		if(!bit_count && symbol != SymbolType::Zero) continue;
		detection_mode_ = use_fast_encoding ? FastData : SlowData;
		result |= ((symbol == SymbolType::One) ? 1 : 0) << bit_count;
		bit_count++;
	}
	// TODO: check parity?
	return tape->is_at_end() ? -1 : ((result >> 1)&0xff);
}